

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O2

void embree::avx2::
     BVHNIntersectorKHybrid<4,_4,_1,_false,_embree::avx2::ArrayIntersectorK_1<4,_embree::avx2::TriangleMiIntersectorKMoeller<4,_4,_true>_>,_true>
     ::occluded(vint<4> *valid_i,Intersectors *This,RayK<4> *ray,RayQueryContext *context)

{
  RayK<4> *pRVar1;
  vfloat<4> vVar2;
  size_t sVar3;
  float *pfVar4;
  Geometry *pGVar5;
  RTCFilterFunctionN p_Var6;
  undefined1 auVar7 [16];
  float fVar8;
  float fVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined8 uVar13;
  undefined8 uVar14;
  bool bVar15;
  uint uVar16;
  undefined4 uVar17;
  int iVar18;
  float *vertices;
  long lVar19;
  ulong uVar20;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *paVar21;
  size_t sVar22;
  ulong uVar23;
  size_t sVar24;
  uint uVar25;
  NodeRef *pNVar26;
  NodeRef root;
  long lVar27;
  size_t i_1;
  long lVar28;
  vint4 ai_2;
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 in_ZMM0 [64];
  float fVar33;
  float fVar39;
  float fVar40;
  vint4 ai;
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  float fVar41;
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [64];
  vint4 bi_3;
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  vint4 bi_2;
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  vint4 bi_1;
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  vint4 ai_1;
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  vint4 ai_3;
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  vint4 bi;
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [64];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  uint uVar78;
  uint uVar79;
  uint uVar80;
  undefined1 auVar77 [64];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  Precalculations pre;
  vbool<4> terminated;
  RTCFilterFunctionNArguments args;
  undefined1 local_19e8 [16];
  undefined1 local_19c8 [16];
  BVH *local_19b0;
  Intersectors *local_19a8;
  long local_19a0;
  Scene *local_1998;
  vuint<4> *v;
  undefined1 local_1988 [16];
  undefined1 local_1978 [16];
  undefined1 local_1968 [16];
  undefined1 local_1958 [16];
  undefined1 local_1948 [16];
  undefined1 local_1938 [8];
  float fStack_1930;
  float fStack_192c;
  undefined1 local_1928 [8];
  float fStack_1920;
  float fStack_191c;
  undefined1 local_1918 [8];
  float fStack_1910;
  float fStack_190c;
  undefined1 local_1908 [16];
  longlong local_18f8;
  longlong lStack_18f0;
  longlong local_18e8;
  longlong lStack_18e0;
  vfloat<4> t;
  vfloat<4> v_1;
  vfloat<4> u;
  TravRayK<4,_false> tray;
  anon_union_48_2_4062524c_for_Vec3<embree::vfloat_impl<4>_>_1 local_1798;
  undefined8 local_1768;
  undefined8 uStack_1760;
  undefined1 local_1758 [8];
  float fStack_1750;
  float fStack_174c;
  float local_1748;
  float fStack_1744;
  float fStack_1740;
  float fStack_173c;
  undefined1 local_1738 [16];
  uint local_1728;
  uint uStack_1724;
  uint uStack_1720;
  uint uStack_171c;
  uint uStack_1718;
  uint uStack_1714;
  uint uStack_1710;
  uint uStack_170c;
  Vec3vf<4> Ng;
  NodeRef stack_node [241];
  vfloat<4> stack_near [241];
  
  uVar14 = mm_lookupmask_ps._8_8_;
  uVar13 = mm_lookupmask_ps._0_8_;
  local_19b0 = (BVH *)This->ptr;
  stack_node[1].ptr = (local_19b0->root).ptr;
  if (stack_node[1].ptr != 8) {
    if ((context->user != (RTCRayQueryContext *)0x0) &&
       ((context->args->flags & RTC_RAY_QUERY_FLAG_COHERENT) != RTC_RAY_QUERY_FLAG_INCOHERENT)) {
      occludedCoherent(valid_i,This,ray,context);
      return;
    }
    auVar47 = vpcmpeqd_avx(in_ZMM0._0_16_,in_ZMM0._0_16_);
    auVar51 = vpcmpeqd_avx(auVar47,(undefined1  [16])valid_i->field_0);
    auVar29 = ZEXT816(0) << 0x40;
    auVar36 = vcmpps_avx(*(undefined1 (*) [16])(ray + 0x80),auVar29,5);
    auVar31 = auVar51 & auVar36;
    if ((((auVar31 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
         (auVar31 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
        (auVar31 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) || auVar31[0xf] < '\0')
    {
      local_1908 = vandps_avx(auVar36,auVar51);
      tray.org.field_0._0_4_ = *(float *)ray;
      tray.org.field_0._4_4_ = *(float *)(ray + 4);
      tray.org.field_0._8_4_ = *(float *)(ray + 8);
      tray.org.field_0._12_4_ = *(float *)(ray + 0xc);
      tray.org.field_0._16_4_ = *(float *)(ray + 0x10);
      tray.org.field_0._20_4_ = *(float *)(ray + 0x14);
      tray.org.field_0._24_4_ = *(float *)(ray + 0x18);
      tray.org.field_0._28_4_ = *(float *)(ray + 0x1c);
      tray.org.field_0._32_4_ = *(float *)(ray + 0x20);
      tray.org.field_0._36_4_ = *(float *)(ray + 0x24);
      tray.org.field_0._40_4_ = *(float *)(ray + 0x28);
      tray.org.field_0._44_4_ = *(float *)(ray + 0x2c);
      tray.dir.field_0.field_0.x.field_0 = (vfloat_impl<4>)*(undefined1 (*) [16])(ray + 0x40);
      tray.dir.field_0.field_0.y.field_0 = (vfloat_impl<4>)*(undefined1 (*) [16])(ray + 0x50);
      tray.dir.field_0.field_0.z.field_0 = (vfloat_impl<4>)*(undefined1 (*) [16])(ray + 0x60);
      local_1988._8_4_ = 0x7fffffff;
      local_1988._0_8_ = 0x7fffffff7fffffff;
      local_1988._12_4_ = 0x7fffffff;
      auVar36 = vandps_avx(local_1988,(undefined1  [16])tray.dir.field_0.field_0.x.field_0);
      auVar70._8_4_ = 0x219392ef;
      auVar70._0_8_ = 0x219392ef219392ef;
      auVar70._12_4_ = 0x219392ef;
      auVar36 = vcmpps_avx(auVar36,auVar70,1);
      auVar51 = vblendvps_avx((undefined1  [16])tray.dir.field_0.field_0.x.field_0,auVar70,auVar36);
      auVar36 = vandps_avx(local_1988,(undefined1  [16])tray.dir.field_0.field_0.y.field_0);
      auVar36 = vcmpps_avx(auVar36,auVar70,1);
      auVar31 = vblendvps_avx((undefined1  [16])tray.dir.field_0.field_0.y.field_0,auVar70,auVar36);
      auVar36 = vandps_avx((undefined1  [16])tray.dir.field_0.field_0.z.field_0,local_1988);
      auVar36 = vcmpps_avx(auVar36,auVar70,1);
      auVar36 = vblendvps_avx((undefined1  [16])tray.dir.field_0.field_0.z.field_0,auVar70,auVar36);
      auVar55 = vrcpps_avx(auVar51);
      auVar71._8_4_ = 0x3f800000;
      auVar71._0_8_ = 0x3f8000003f800000;
      auVar71._12_4_ = 0x3f800000;
      auVar51 = vfnmadd213ps_fma(auVar51,auVar55,auVar71);
      tray.rdir.field_0.field_0.x.field_0 = (vfloat_impl<4>)vfmadd132ps_fma(auVar51,auVar55,auVar55)
      ;
      auVar51 = vrcpps_avx(auVar31);
      auVar31 = vfnmadd213ps_fma(auVar31,auVar51,auVar71);
      tray.rdir.field_0.field_0.y.field_0 = (vfloat_impl<4>)vfmadd132ps_fma(auVar31,auVar51,auVar51)
      ;
      auVar51 = vrcpps_avx(auVar36);
      auVar36 = vfnmadd213ps_fma(auVar36,auVar51,auVar71);
      tray.rdir.field_0.field_0.z.field_0 = (vfloat_impl<4>)vfmadd132ps_fma(auVar36,auVar51,auVar51)
      ;
      tray.org_rdir.field_0._0_4_ = tray.rdir.field_0._0_4_ * *(float *)ray;
      tray.org_rdir.field_0._4_4_ = tray.rdir.field_0._4_4_ * *(float *)(ray + 4);
      tray.org_rdir.field_0._8_4_ = tray.rdir.field_0._8_4_ * *(float *)(ray + 8);
      tray.org_rdir.field_0._12_4_ = tray.rdir.field_0._12_4_ * *(float *)(ray + 0xc);
      tray.org_rdir.field_0._16_4_ = *(float *)(ray + 0x10) * tray.rdir.field_0._16_4_;
      tray.org_rdir.field_0._20_4_ = *(float *)(ray + 0x14) * tray.rdir.field_0._20_4_;
      tray.org_rdir.field_0._24_4_ = *(float *)(ray + 0x18) * tray.rdir.field_0._24_4_;
      tray.org_rdir.field_0._28_4_ = *(float *)(ray + 0x1c) * tray.rdir.field_0._28_4_;
      tray.org_rdir.field_0._32_4_ = *(float *)(ray + 0x20) * tray.rdir.field_0._32_4_;
      tray.org_rdir.field_0._36_4_ = *(float *)(ray + 0x24) * tray.rdir.field_0._36_4_;
      tray.org_rdir.field_0._40_4_ = *(float *)(ray + 0x28) * tray.rdir.field_0._40_4_;
      tray.org_rdir.field_0._44_4_ = *(float *)(ray + 0x2c) * tray.rdir.field_0._44_4_;
      auVar36 = vcmpps_avx((undefined1  [16])tray.rdir.field_0.field_0.x.field_0,auVar29,1);
      auVar51._8_4_ = 0x10;
      auVar51._0_8_ = 0x1000000010;
      auVar51._12_4_ = 0x10;
      tray.nearXYZ.field_0.field_0.x.field_0 = (vint_impl<4>)vandps_avx(auVar36,auVar51);
      auVar36 = vcmpps_avx((undefined1  [16])tray.rdir.field_0.field_0.y.field_0,auVar29,5);
      auVar31._8_4_ = 0x20;
      auVar31._0_8_ = 0x2000000020;
      auVar31._12_4_ = 0x20;
      auVar55._8_4_ = 0x30;
      auVar55._0_8_ = 0x3000000030;
      auVar55._12_4_ = 0x30;
      tray.nearXYZ.field_0.field_0.y.field_0 = (vint_impl<4>)vblendvps_avx(auVar55,auVar31,auVar36);
      auVar36 = vcmpps_avx((undefined1  [16])tray.rdir.field_0.field_0.z.field_0,auVar29,5);
      auVar56._8_4_ = 0x40;
      auVar56._0_8_ = 0x4000000040;
      auVar56._12_4_ = 0x40;
      auVar60._8_4_ = 0x50;
      auVar60._0_8_ = 0x5000000050;
      auVar60._12_4_ = 0x50;
      tray.nearXYZ.field_0.field_0.z.field_0 = (vint_impl<4>)vblendvps_avx(auVar60,auVar56,auVar36);
      auVar36 = vmaxps_avx(*(undefined1 (*) [16])(ray + 0x30),auVar29);
      auVar51 = vmaxps_avx(*(undefined1 (*) [16])(ray + 0x80),auVar29);
      stack_near[0].field_0.i[2] = 0x7f800000;
      stack_near[0].field_0._0_8_ = 0x7f8000007f800000;
      stack_near[0].field_0.i[3] = 0x7f800000;
      auVar74 = ZEXT1664((undefined1  [16])stack_near[0].field_0);
      tray.tnear.field_0 =
           (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
           vblendvps_avx((undefined1  [16])stack_near[0].field_0,auVar36,local_1908);
      auVar38 = ZEXT1664((undefined1  [16])tray.tnear.field_0);
      auVar36._8_4_ = 0xff800000;
      auVar36._0_8_ = 0xff800000ff800000;
      auVar36._12_4_ = 0xff800000;
      tray.tfar.field_0 =
           (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)vblendvps_avx(auVar36,auVar51,local_1908);
      terminated.field_0.i[1] = local_1908._4_4_ ^ auVar47._4_4_;
      terminated.field_0.i[0] = local_1908._0_4_ ^ auVar47._0_4_;
      terminated.field_0.i[2] = local_1908._8_4_ ^ auVar47._8_4_;
      terminated.field_0.i[3] = local_1908._12_4_ ^ auVar47._12_4_;
      if (context->user == (RTCRayQueryContext *)0x0) {
        uVar25 = 3;
      }
      else {
        uVar25 = ((context->args->flags & RTC_RAY_QUERY_FLAG_COHERENT) ==
                 RTC_RAY_QUERY_FLAG_INCOHERENT) + 2;
      }
      pRVar1 = ray + 0x80;
      pNVar26 = stack_node + 2;
      stack_node[0].ptr = 0xfffffffffffffff8;
      paVar21 = &stack_near[2].field_0;
      stack_near[1].field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)tray.tnear;
      local_19a8 = This;
LAB_0154176c:
      do {
        do {
          root.ptr = pNVar26[-1].ptr;
          if (root.ptr == 0xfffffffffffffff8) goto LAB_015421de;
          pNVar26 = pNVar26 + -1;
          paVar21 = paVar21 + -1;
          vVar2.field_0 = *(anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)paVar21->v;
          auVar77 = ZEXT1664((undefined1  [16])vVar2.field_0);
          auVar36 = vcmpps_avx((undefined1  [16])vVar2.field_0,(undefined1  [16])tray.tfar.field_0,1
                              );
          uVar16 = vmovmskps_avx(auVar36);
        } while (uVar16 == 0);
        uVar20 = (ulong)(uVar16 & 0xff);
        uVar16 = POPCOUNT(uVar16 & 0xff);
        if (uVar25 < uVar16) {
LAB_015417ab:
          do {
            iVar18 = 4;
            if ((root.ptr & 8) != 0) {
              if (root.ptr == 0xfffffffffffffff8) goto LAB_015421de;
              auVar36 = vcmpps_avx((undefined1  [16])tray.tfar.field_0,auVar77._0_16_,6);
              if ((((auVar36 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                   (auVar36 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                  (auVar36 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                  -1 < auVar36[0xf]) goto LAB_0154176c;
              local_19a0 = (ulong)((uint)root.ptr & 0xf) - 8;
              auVar36 = vpcmpeqd_avx(auVar36,auVar36);
              lVar19 = (root.ptr & 0xfffffffffffffff0) + 0x40;
              lVar27 = 0;
              local_19e8 = auVar36 ^ (undefined1  [16])terminated.field_0;
              goto LAB_01541990;
            }
            sVar24 = 8;
            auVar36 = auVar74._0_16_;
            for (lVar19 = 0;
                (auVar77 = ZEXT1664(auVar36), lVar19 != 4 &&
                (sVar3 = *(size_t *)((root.ptr & 0xfffffffffffffff0) + lVar19 * 8), sVar3 != 8));
                lVar19 = lVar19 + 1) {
              uVar17 = *(undefined4 *)(root.ptr + 0x20 + lVar19 * 4);
              auVar34._4_4_ = uVar17;
              auVar34._0_4_ = uVar17;
              auVar34._8_4_ = uVar17;
              auVar34._12_4_ = uVar17;
              auVar10._4_4_ = tray.org_rdir.field_0._4_4_;
              auVar10._0_4_ = tray.org_rdir.field_0._0_4_;
              auVar10._8_4_ = tray.org_rdir.field_0._8_4_;
              auVar10._12_4_ = tray.org_rdir.field_0._12_4_;
              auVar29 = vfmsub213ps_fma(auVar34,(undefined1  [16])
                                                tray.rdir.field_0.field_0.x.field_0,auVar10);
              uVar17 = *(undefined4 *)(root.ptr + 0x40 + lVar19 * 4);
              auVar57._4_4_ = uVar17;
              auVar57._0_4_ = uVar17;
              auVar57._8_4_ = uVar17;
              auVar57._12_4_ = uVar17;
              auVar11._4_4_ = tray.org_rdir.field_0._20_4_;
              auVar11._0_4_ = tray.org_rdir.field_0._16_4_;
              auVar11._8_4_ = tray.org_rdir.field_0._24_4_;
              auVar11._12_4_ = tray.org_rdir.field_0._28_4_;
              auVar55 = vfmsub213ps_fma(auVar57,(undefined1  [16])
                                                tray.rdir.field_0.field_0.y.field_0,auVar11);
              uVar17 = *(undefined4 *)(root.ptr + 0x60 + lVar19 * 4);
              auVar63._4_4_ = uVar17;
              auVar63._0_4_ = uVar17;
              auVar63._8_4_ = uVar17;
              auVar63._12_4_ = uVar17;
              auVar12._4_4_ = tray.org_rdir.field_0._36_4_;
              auVar12._0_4_ = tray.org_rdir.field_0._32_4_;
              auVar12._8_4_ = tray.org_rdir.field_0._40_4_;
              auVar12._12_4_ = tray.org_rdir.field_0._44_4_;
              auVar56 = vfmsub213ps_fma(auVar63,(undefined1  [16])
                                                tray.rdir.field_0.field_0.z.field_0,auVar12);
              uVar17 = *(undefined4 *)(root.ptr + 0x30 + lVar19 * 4);
              auVar67._4_4_ = uVar17;
              auVar67._0_4_ = uVar17;
              auVar67._8_4_ = uVar17;
              auVar67._12_4_ = uVar17;
              auVar60 = vfmsub213ps_fma(auVar67,(undefined1  [16])
                                                tray.rdir.field_0.field_0.x.field_0,auVar10);
              uVar17 = *(undefined4 *)(root.ptr + 0x50 + lVar19 * 4);
              auVar52._4_4_ = uVar17;
              auVar52._0_4_ = uVar17;
              auVar52._8_4_ = uVar17;
              auVar52._12_4_ = uVar17;
              auVar70 = vfmsub213ps_fma(auVar52,(undefined1  [16])
                                                tray.rdir.field_0.field_0.y.field_0,auVar11);
              uVar17 = *(undefined4 *)(root.ptr + 0x70 + lVar19 * 4);
              auVar42._4_4_ = uVar17;
              auVar42._0_4_ = uVar17;
              auVar42._8_4_ = uVar17;
              auVar42._12_4_ = uVar17;
              auVar71 = vfmsub213ps_fma(auVar42,(undefined1  [16])
                                                tray.rdir.field_0.field_0.z.field_0,auVar12);
              auVar47 = vpminsd_avx(auVar29,auVar60);
              auVar51 = vpminsd_avx(auVar55,auVar70);
              auVar47 = vpmaxsd_avx(auVar47,auVar51);
              auVar51 = vpminsd_avx(auVar56,auVar71);
              auVar31 = vpmaxsd_avx(auVar47,auVar51);
              auVar47 = vpmaxsd_avx(auVar29,auVar60);
              auVar51 = vpmaxsd_avx(auVar55,auVar70);
              auVar51 = vpminsd_avx(auVar47,auVar51);
              auVar47 = vpmaxsd_avx(auVar56,auVar71);
              auVar51 = vpminsd_avx(auVar51,auVar47);
              auVar47 = vpmaxsd_avx(auVar31,(undefined1  [16])tray.tnear.field_0);
              auVar51 = vpminsd_avx(auVar51,(undefined1  [16])tray.tfar.field_0);
              auVar51 = vcmpps_avx(auVar47,auVar51,2);
              auVar38 = ZEXT1664(auVar51);
              sVar22 = sVar24;
              auVar47 = auVar36;
              if (((((auVar51 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                    (auVar51 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                   (auVar51 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                   auVar51[0xf] < '\0') &&
                 (auVar47 = vblendvps_avx(auVar74._0_16_,auVar31,auVar51), sVar22 = sVar3,
                 sVar24 != 8)) {
                pNVar26->ptr = sVar24;
                pNVar26 = pNVar26 + 1;
                *(undefined1 (*) [16])paVar21->v = auVar36;
                paVar21 = paVar21 + 1;
              }
              auVar36 = auVar47;
              sVar24 = sVar22;
            }
            if (sVar24 == 8) goto LAB_01541920;
            auVar47 = vcmpps_avx((undefined1  [16])tray.tfar.field_0,auVar36,6);
            uVar17 = vmovmskps_avx(auVar47);
            root.ptr = sVar24;
          } while ((byte)uVar25 < (byte)POPCOUNT(uVar17));
          pNVar26->ptr = sVar24;
          pNVar26 = pNVar26 + 1;
          *(undefined1 (*) [16])paVar21->v = auVar36;
          paVar21 = paVar21 + 1;
        }
        else {
          while (uVar20 != 0) {
            sVar24 = 0;
            for (uVar23 = uVar20; (uVar23 & 1) == 0; uVar23 = uVar23 >> 1 | 0x8000000000000000) {
              sVar24 = sVar24 + 1;
            }
            uVar20 = uVar20 - 1 & uVar20;
            auVar38 = ZEXT1664(auVar38._0_16_);
            bVar15 = occluded1(local_19a8,local_19b0,root,sVar24,&pre,ray,&tray,context);
            if (bVar15) {
              terminated.field_0.i[sVar24] = -1;
            }
          }
          auVar36 = _DAT_01f46b70 & ~(undefined1  [16])terminated.field_0;
          iVar18 = 3;
          auVar74 = ZEXT1664(CONCAT412(0x7f800000,CONCAT48(0x7f800000,0x7f8000007f800000)));
          auVar77 = ZEXT1664((undefined1  [16])vVar2.field_0);
          if ((((auVar36 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
               (auVar36 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              (auVar36 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              auVar36[0xf] < '\0') {
            auVar38 = ZEXT1664((undefined1  [16])tray.tfar.field_0);
            auVar47._8_4_ = 0xff800000;
            auVar47._0_8_ = 0xff800000ff800000;
            auVar47._12_4_ = 0xff800000;
            tray.tfar.field_0 =
                 (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                 vblendvps_avx((undefined1  [16])tray.tfar.field_0,auVar47,
                               (undefined1  [16])terminated.field_0);
            iVar18 = 2;
          }
          if (uVar25 < uVar16) goto LAB_015417ab;
        }
LAB_01541920:
      } while ((iVar18 == 4) || (iVar18 == 2));
LAB_015421de:
      auVar36 = vandps_avx(local_1908,(undefined1  [16])terminated.field_0);
      auVar37._8_4_ = 0xff800000;
      auVar37._0_8_ = 0xff800000ff800000;
      auVar37._12_4_ = 0xff800000;
      auVar36 = vmaskmovps_avx(auVar36,auVar37);
      *(undefined1 (*) [16])pRVar1 = auVar36;
    }
  }
  return;
LAB_01541990:
  do {
    auVar36 = auVar38._0_16_;
    if (lVar27 == local_19a0) break;
    v = (vuint<4> *)(lVar27 * 0x50 + (root.ptr & 0xfffffffffffffff0));
    local_1998 = context->scene;
    lVar28 = 0;
    auVar47 = local_19e8;
    do {
      if ((lVar28 == 4) || (*(int *)(lVar19 + lVar28 * 4) == -1)) break;
      pfVar4 = (local_1998->vertices).items[*(uint *)(lVar19 + -0x10 + lVar28 * 4)];
      uVar20 = (ulong)*(uint *)(lVar19 + -0x40 + lVar28 * 4);
      uVar23 = (ulong)*(uint *)(lVar19 + -0x30 + lVar28 * 4);
      fVar33 = pfVar4[uVar20];
      auVar53._4_4_ = fVar33;
      auVar53._0_4_ = fVar33;
      auVar53._8_4_ = fVar33;
      auVar53._12_4_ = fVar33;
      fVar39 = pfVar4[uVar20 + 1];
      auVar61._4_4_ = fVar39;
      auVar61._0_4_ = fVar39;
      auVar61._8_4_ = fVar39;
      auVar61._12_4_ = fVar39;
      fVar40 = pfVar4[uVar20 + 2];
      auVar65._4_4_ = fVar40;
      auVar65._0_4_ = fVar40;
      auVar65._8_4_ = fVar40;
      auVar65._12_4_ = fVar40;
      uVar20 = (ulong)*(uint *)(lVar19 + -0x20 + lVar28 * 4);
      fVar8 = fVar33 - pfVar4[uVar23];
      fVar41 = fVar39 - pfVar4[uVar23 + 1];
      fVar9 = fVar40 - pfVar4[uVar23 + 2];
      local_18e8 = v[3].field_0.v[0];
      lStack_18e0 = v[3].field_0.v[1];
      local_18f8 = v[4].field_0.v[0];
      lStack_18f0 = v[4].field_0.v[1];
      auVar48._4_4_ = fVar8;
      auVar48._0_4_ = fVar8;
      auVar48._8_4_ = fVar8;
      auVar48._12_4_ = fVar8;
      auVar58._4_4_ = fVar41;
      auVar58._0_4_ = fVar41;
      auVar58._8_4_ = fVar41;
      auVar58._12_4_ = fVar41;
      auVar64._4_4_ = fVar9;
      auVar64._0_4_ = fVar9;
      auVar64._8_4_ = fVar9;
      auVar64._12_4_ = fVar9;
      fVar33 = pfVar4[uVar20] - fVar33;
      auVar72._4_4_ = fVar33;
      auVar72._0_4_ = fVar33;
      auVar72._8_4_ = fVar33;
      auVar72._12_4_ = fVar33;
      fVar39 = pfVar4[uVar20 + 1] - fVar39;
      auVar75._4_4_ = fVar39;
      auVar75._0_4_ = fVar39;
      auVar75._8_4_ = fVar39;
      auVar75._12_4_ = fVar39;
      fVar40 = pfVar4[uVar20 + 2] - fVar40;
      auVar81._4_4_ = fVar40;
      auVar81._0_4_ = fVar40;
      auVar81._8_4_ = fVar40;
      auVar81._12_4_ = fVar40;
      fVar41 = fVar41 * fVar40;
      auVar29._4_4_ = fVar41;
      auVar29._0_4_ = fVar41;
      auVar29._8_4_ = fVar41;
      auVar29._12_4_ = fVar41;
      auVar70 = vfmsub231ps_fma(auVar29,auVar75,auVar64);
      fVar33 = fVar9 * fVar33;
      auVar35._4_4_ = fVar33;
      auVar35._0_4_ = fVar33;
      auVar35._8_4_ = fVar33;
      auVar35._12_4_ = fVar33;
      auVar71 = vfmsub231ps_fma(auVar35,auVar81,auVar48);
      fVar39 = fVar39 * fVar8;
      auVar43._4_4_ = fVar39;
      auVar43._0_4_ = fVar39;
      auVar43._8_4_ = fVar39;
      auVar43._12_4_ = fVar39;
      auVar29 = vsubps_avx(auVar53,*(undefined1 (*) [16])ray);
      auVar55 = vsubps_avx(auVar61,*(undefined1 (*) [16])(ray + 0x10));
      auVar35 = vfmsub231ps_fma(auVar43,auVar72,auVar58);
      auVar56 = vsubps_avx(auVar65,*(undefined1 (*) [16])(ray + 0x20));
      auVar36 = *(undefined1 (*) [16])(ray + 0x40);
      auVar51 = *(undefined1 (*) [16])(ray + 0x50);
      auVar31 = *(undefined1 (*) [16])(ray + 0x60);
      auVar82._0_4_ = auVar36._0_4_ * auVar55._0_4_;
      auVar82._4_4_ = auVar36._4_4_ * auVar55._4_4_;
      auVar82._8_4_ = auVar36._8_4_ * auVar55._8_4_;
      auVar82._12_4_ = auVar36._12_4_ * auVar55._12_4_;
      auVar43 = vfmsub231ps_fma(auVar82,auVar29,auVar51);
      auVar66._0_4_ = auVar31._0_4_ * auVar35._0_4_;
      auVar66._4_4_ = auVar31._4_4_ * auVar35._4_4_;
      auVar66._8_4_ = auVar31._8_4_ * auVar35._8_4_;
      auVar66._12_4_ = auVar31._12_4_ * auVar35._12_4_;
      auVar60 = vfmadd231ps_fma(auVar66,auVar71,auVar51);
      auVar83._0_4_ = auVar51._0_4_ * auVar56._0_4_;
      auVar83._4_4_ = auVar51._4_4_ * auVar56._4_4_;
      auVar83._8_4_ = auVar51._8_4_ * auVar56._8_4_;
      auVar83._12_4_ = auVar51._12_4_ * auVar56._12_4_;
      auVar53 = vfmsub231ps_fma(auVar83,auVar55,auVar31);
      auVar84._0_4_ = auVar31._0_4_ * auVar29._0_4_;
      auVar84._4_4_ = auVar31._4_4_ * auVar29._4_4_;
      auVar84._8_4_ = auVar31._8_4_ * auVar29._8_4_;
      auVar84._12_4_ = auVar31._12_4_ * auVar29._12_4_;
      auVar61 = vfmsub231ps_fma(auVar84,auVar56,auVar36);
      auVar31 = vfmadd231ps_fma(auVar60,auVar70,auVar36);
      auVar49._0_4_ = fVar40 * auVar43._0_4_;
      auVar49._4_4_ = fVar40 * auVar43._4_4_;
      auVar49._8_4_ = fVar40 * auVar43._8_4_;
      auVar49._12_4_ = fVar40 * auVar43._12_4_;
      auVar51 = vfmadd231ps_fma(auVar49,auVar61,auVar75);
      auVar76._8_4_ = 0x80000000;
      auVar76._0_8_ = 0x8000000080000000;
      auVar76._12_4_ = 0x80000000;
      auVar36 = vandps_avx(auVar31,auVar76);
      auVar51 = vfmadd231ps_fma(auVar51,auVar53,auVar72);
      uVar16 = auVar36._0_4_;
      auVar73._0_4_ = uVar16 ^ auVar51._0_4_;
      uVar78 = auVar36._4_4_;
      auVar73._4_4_ = uVar78 ^ auVar51._4_4_;
      uVar79 = auVar36._8_4_;
      auVar73._8_4_ = uVar79 ^ auVar51._8_4_;
      uVar80 = auVar36._12_4_;
      auVar73._12_4_ = uVar80 ^ auVar51._12_4_;
      auVar36 = vcmpps_avx(auVar73,_DAT_01f45a50,5);
      auVar51 = auVar47 & auVar36;
      if ((((auVar51 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
           (auVar51 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
          (auVar51 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) && -1 < auVar51[0xf])
      {
LAB_01541b4b:
        auVar7._8_8_ = uVar14;
        auVar7._0_8_ = uVar13;
      }
      else {
        auVar36 = vandps_avx(auVar36,auVar47);
        auVar50._0_4_ = auVar43._0_4_ * fVar9;
        auVar50._4_4_ = auVar43._4_4_ * fVar9;
        auVar50._8_4_ = auVar43._8_4_ * fVar9;
        auVar50._12_4_ = auVar43._12_4_ * fVar9;
        auVar51 = vfmadd213ps_fma(auVar61,auVar58,auVar50);
        auVar51 = vfmadd132ps_fma(auVar53,auVar51,auVar48);
        auVar59._0_4_ = uVar16 ^ auVar51._0_4_;
        auVar59._4_4_ = uVar78 ^ auVar51._4_4_;
        auVar59._8_4_ = uVar79 ^ auVar51._8_4_;
        auVar59._12_4_ = uVar80 ^ auVar51._12_4_;
        auVar51 = vcmpps_avx(auVar59,_DAT_01f45a50,5);
        auVar60 = auVar36 & auVar51;
        if ((((auVar60 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
             (auVar60 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
            (auVar60 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) && -1 < auVar60[0xf]
           ) goto LAB_01541b4b;
        auVar60 = vandps_avx(auVar31,local_1988);
        auVar36 = vandps_avx(auVar36,auVar51);
        auVar51 = vsubps_avx(auVar60,auVar73);
        auVar51 = vcmpps_avx(auVar51,auVar59,5);
        auVar43 = auVar36 & auVar51;
        if ((((auVar43 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
             (auVar43 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
            (auVar43 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) && -1 < auVar43[0xf]
           ) goto LAB_01541b4b;
        auVar36 = vandps_avx(auVar51,auVar36);
        auVar68._0_4_ = auVar56._0_4_ * auVar35._0_4_;
        auVar68._4_4_ = auVar56._4_4_ * auVar35._4_4_;
        auVar68._8_4_ = auVar56._8_4_ * auVar35._8_4_;
        auVar68._12_4_ = auVar56._12_4_ * auVar35._12_4_;
        auVar51 = vfmadd213ps_fma(auVar55,auVar71,auVar68);
        auVar51 = vfmadd213ps_fma(auVar29,auVar70,auVar51);
        auVar54._0_4_ = uVar16 ^ auVar51._0_4_;
        auVar54._4_4_ = uVar78 ^ auVar51._4_4_;
        auVar54._8_4_ = uVar79 ^ auVar51._8_4_;
        auVar54._12_4_ = uVar80 ^ auVar51._12_4_;
        auVar62._0_4_ = auVar60._0_4_ * *(float *)(ray + 0x30);
        auVar62._4_4_ = auVar60._4_4_ * *(float *)(ray + 0x34);
        auVar62._8_4_ = auVar60._8_4_ * *(float *)(ray + 0x38);
        auVar62._12_4_ = auVar60._12_4_ * *(float *)(ray + 0x3c);
        auVar69._0_4_ = auVar60._0_4_ * *(float *)(ray + 0x80);
        auVar69._4_4_ = auVar60._4_4_ * *(float *)(ray + 0x84);
        auVar69._8_4_ = auVar60._8_4_ * *(float *)(ray + 0x88);
        auVar69._12_4_ = auVar60._12_4_ * *(float *)(ray + 0x8c);
        auVar51 = vcmpps_avx(auVar62,auVar54,1);
        auVar29 = vcmpps_avx(auVar54,auVar69,2);
        auVar51 = vandps_avx(auVar29,auVar51);
        auVar29 = auVar36 & auVar51;
        if ((((auVar29 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
             (auVar29 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
            (auVar29 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) && -1 < auVar29[0xf]
           ) {
LAB_01542089:
          auVar7._8_8_ = uVar14;
          auVar7._0_8_ = uVar13;
        }
        else {
          auVar36 = vandps_avx(auVar51,auVar36);
          auVar51 = vcmpps_avx(auVar31,_DAT_01f45a50,4);
          auVar31 = auVar36 & auVar51;
          if ((((auVar31 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
               (auVar31 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
              (auVar31 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
              -1 < auVar31[0xf]) goto LAB_01542089;
          auVar7 = vandps_avx(auVar51,auVar36);
          local_1978 = auVar35;
          local_1968 = auVar71;
          local_1958 = auVar70;
          local_1948 = auVar60;
          _local_1938 = auVar54;
          _local_1928 = auVar59;
          _local_1918 = auVar73;
        }
      }
      uVar78 = *(uint *)((long)&local_18e8 + lVar28 * 4);
      pGVar5 = (context->scene->geometries).items[uVar78].ptr;
      uVar16 = pGVar5->mask;
      auVar30._4_4_ = uVar16;
      auVar30._0_4_ = uVar16;
      auVar30._8_4_ = uVar16;
      auVar30._12_4_ = uVar16;
      auVar36 = vpand_avx(auVar30,*(undefined1 (*) [16])(ray + 0x90));
      auVar36 = vpcmpeqd_avx(auVar36,_DAT_01f45a50);
      auVar51 = auVar7 & ~auVar36;
      auVar74 = ZEXT1664(CONCAT412(0x7f800000,CONCAT48(0x7f800000,0x7f8000007f800000)));
      if ((((auVar51 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
           (auVar51 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
          (auVar51 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) || auVar51[0xf] < '\0'
         ) {
        uVar17 = *(undefined4 *)((long)&local_18f8 + lVar28 * 4);
        auVar36 = vandnps_avx(auVar36,auVar7);
        if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
           (pGVar5->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
          auVar51 = vrcpps_avx(local_1948);
          auVar44._8_4_ = 0x3f800000;
          auVar44._0_8_ = 0x3f8000003f800000;
          auVar44._12_4_ = 0x3f800000;
          auVar31 = vfnmadd213ps_fma(auVar51,local_1948,auVar44);
          auVar51 = vfmadd132ps_fma(auVar31,auVar51,auVar51);
          fVar33 = auVar51._0_4_;
          fVar39 = auVar51._4_4_;
          fVar40 = auVar51._8_4_;
          fVar41 = auVar51._12_4_;
          local_1748 = fVar33 * (float)local_1918._0_4_;
          fStack_1744 = fVar39 * (float)local_1918._4_4_;
          fStack_1740 = fVar40 * fStack_1910;
          fStack_173c = fVar41 * fStack_190c;
          local_1798._0_8_ = local_1958._0_8_;
          local_1798._8_8_ = local_1958._8_8_;
          local_1798._16_8_ = local_1968._0_8_;
          local_1798._24_8_ = local_1968._8_8_;
          local_1798._32_8_ = local_1978._0_8_;
          local_1798._40_8_ = local_1978._8_8_;
          local_1768 = CONCAT44(fVar39 * (float)local_1938._4_4_,fVar33 * (float)local_1938._0_4_);
          uStack_1760 = CONCAT44(fVar41 * fStack_192c,fVar40 * fStack_1930);
          local_1758._4_4_ = fVar39 * (float)local_1928._4_4_;
          local_1758._0_4_ = fVar33 * (float)local_1928._0_4_;
          fStack_1750 = fVar40 * fStack_1920;
          fStack_174c = fVar41 * fStack_191c;
          args.valid = (int *)&Ng;
          args.geometryUserPtr = &t;
          args.context = (RTCRayQueryContext *)&v_1;
          args.ray = (RTCRayN *)&u;
          std::
          _Tuple_impl<0ul,embree::vfloat_impl<4>&,embree::vfloat_impl<4>&,embree::vfloat_impl<4>&,embree::Vec3<embree::vfloat_impl<4>>&>
          ::
          _M_assign<embree::vfloat_impl<4>,embree::vfloat_impl<4>,embree::vfloat_impl<4>,embree::Vec3<embree::vfloat_impl<4>>>
                    ((_Tuple_impl<0UL,_embree::vfloat_impl<4>_&,_embree::vfloat_impl<4>_&,_embree::vfloat_impl<4>_&,_embree::Vec3<embree::vfloat_impl<4>_>_&>
                      *)&args,(_Tuple_impl<0UL,_embree::vfloat_impl<4>,_embree::vfloat_impl<4>,_embree::vfloat_impl<4>,_embree::Vec3<embree::vfloat_impl<4>_>_>
                               *)&local_1798.field_0);
          local_1738._4_4_ = uVar78;
          local_1738._0_4_ = uVar78;
          local_1738._8_4_ = uVar78;
          local_1738._12_4_ = uVar78;
          local_1798._0_8_ = Ng.field_0._0_8_;
          local_1798._8_8_ = Ng.field_0._8_8_;
          local_1798._16_8_ = Ng.field_0._16_8_;
          local_1798._24_8_ = Ng.field_0._24_8_;
          local_1798._32_8_ = Ng.field_0._32_8_;
          local_1798._40_8_ = Ng.field_0._40_8_;
          local_1768 = u.field_0._0_8_;
          uStack_1760 = u.field_0._8_8_;
          _local_1758 = v_1.field_0;
          local_1748 = (float)uVar17;
          fStack_1744 = (float)uVar17;
          fStack_1740 = (float)uVar17;
          fStack_173c = (float)uVar17;
          vpcmpeqd_avx2(ZEXT1632(local_1738),ZEXT1632(local_1738));
          uStack_1724 = context->user->instID[0];
          local_1728 = uStack_1724;
          uStack_1720 = uStack_1724;
          uStack_171c = uStack_1724;
          uStack_1718 = context->user->instPrimID[0];
          uStack_1714 = uStack_1718;
          uStack_1710 = uStack_1718;
          uStack_170c = uStack_1718;
          auVar51 = *(undefined1 (*) [16])(ray + 0x80);
          auVar31 = vblendvps_avx(auVar51,(undefined1  [16])t.field_0,auVar36);
          *(undefined1 (*) [16])(ray + 0x80) = auVar31;
          args.valid = (int *)local_19c8;
          args.geometryUserPtr = pGVar5->userPtr;
          args.context = context->user;
          args.hit = (RTCHitN *)&local_1798;
          args.N = 4;
          args.ray = (RTCRayN *)ray;
          local_19c8 = auVar36;
          if (pGVar5->occlusionFilterN != (RTCFilterFunctionN)0x0) {
            (*pGVar5->occlusionFilterN)(&args);
          }
          if (local_19c8 == (undefined1  [16])0x0) {
            auVar36 = vpcmpeqd_avx((undefined1  [16])0x0,_DAT_01f45a50);
            auVar36 = auVar36 ^ _DAT_01f46b70;
            auVar74 = ZEXT1664(CONCAT412(0x7f800000,CONCAT48(0x7f800000,0x7f8000007f800000)));
          }
          else {
            p_Var6 = context->args->filter;
            if (p_Var6 == (RTCFilterFunctionN)0x0) {
              auVar74 = ZEXT1664(CONCAT412(0x7f800000,CONCAT48(0x7f800000,0x7f8000007f800000)));
            }
            else {
              auVar74 = ZEXT1664(CONCAT412(0x7f800000,CONCAT48(0x7f800000,0x7f8000007f800000)));
              if (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                   RTC_RAY_QUERY_FLAG_INCOHERENT) || (((pGVar5->field_8).field_0x2 & 0x40) != 0)) {
                (*p_Var6)(&args);
                auVar74 = ZEXT1664(CONCAT412(0x7f800000,CONCAT48(0x7f800000,0x7f8000007f800000)));
              }
            }
            auVar31 = vpcmpeqd_avx(local_19c8,_DAT_01f45a50);
            auVar36 = auVar31 ^ _DAT_01f46b70;
            auVar45._8_4_ = 0xff800000;
            auVar45._0_8_ = 0xff800000ff800000;
            auVar45._12_4_ = 0xff800000;
            auVar31 = vblendvps_avx(auVar45,*(undefined1 (*) [16])(args.ray + 0x80),auVar31);
            *(undefined1 (*) [16])(args.ray + 0x80) = auVar31;
          }
          auVar31 = vpslld_avx(auVar36,0x1f);
          auVar36 = vpsrad_avx(auVar31,0x1f);
          auVar51 = vblendvps_avx(auVar51,*(undefined1 (*) [16])pRVar1,auVar31);
          *(undefined1 (*) [16])pRVar1 = auVar51;
        }
        auVar47 = vpandn_avx(auVar36,auVar47);
      }
      lVar28 = lVar28 + 1;
    } while ((((auVar47 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
              (auVar47 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
             (auVar47 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
             auVar47[0xf] < '\0');
    auVar38 = ZEXT1664(local_19e8);
    auVar51 = vandps_avx(auVar47,local_19e8);
    lVar27 = lVar27 + 1;
    lVar19 = lVar19 + 0x50;
    auVar47 = local_19e8 & auVar47;
    auVar36 = local_19e8;
    local_19e8 = auVar51;
  } while ((((auVar47 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
            (auVar47 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
           (auVar47 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
           auVar47[0xf] < '\0');
  auVar36 = vpcmpeqd_avx(auVar36,auVar36);
  auVar32._0_4_ = local_19e8._0_4_ ^ auVar36._0_4_;
  auVar32._4_4_ = local_19e8._4_4_ ^ auVar36._4_4_;
  auVar32._8_4_ = local_19e8._8_4_ ^ auVar36._8_4_;
  auVar32._12_4_ = local_19e8._12_4_ ^ auVar36._12_4_;
  terminated.field_0 =
       (anon_union_16_2_9473010e_for_vboolf_impl<4>_1)
       vorps_avx(auVar32,(undefined1  [16])terminated.field_0);
  auVar36 = auVar36 & ~(undefined1  [16])terminated.field_0;
  if ((((auVar36 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
       (auVar36 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
      (auVar36 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) && -1 < auVar36[0xf])
  goto LAB_015421de;
  auVar38 = ZEXT1664((undefined1  [16])tray.tfar.field_0);
  auVar46._8_4_ = 0xff800000;
  auVar46._0_8_ = 0xff800000ff800000;
  auVar46._12_4_ = 0xff800000;
  tray.tfar.field_0 =
       (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
       vblendvps_avx((undefined1  [16])tray.tfar.field_0,auVar46,
                     (undefined1  [16])terminated.field_0);
  goto LAB_0154176c;
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded(vint<K>* __restrict__ valid_i,
                                                                                              Accel::Intersectors* __restrict__ This,
                                                                                              RayK<K>& __restrict__ ray,
                                                                                              RayQueryContext* context)
    {
      BVH* __restrict__ bvh = (BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
#if ENABLE_FAST_COHERENT_CODEPATHS == 1
      assert(context);
      if (unlikely(types == BVH_AN1 && context->user && context->isCoherent()))
      {
        occludedCoherent(valid_i, This, ray, context);
        return;
      }
#endif

      /* filter out already occluded and invalid rays */
      vbool<K> valid = (*valid_i == -1) & (ray.tfar >= 0.0f);
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      valid &= ray.valid();
#endif

      /* return if there are no valid rays */
      const size_t valid_bits = movemask(valid);
      if (unlikely(valid_bits == 0)) return;

      /* verify correct input */
      assert(all(valid, ray.valid()));
      assert(all(valid, ray.tnear() >= 0.0f));
      assert(!(types & BVH_MB) || all(valid, (ray.time() >= 0.0f) & (ray.time() <= 1.0f)));
      Precalculations pre(valid, ray);

      /* load ray */
      TravRayK<K, robust> tray(ray.org, ray.dir, single ? N : 0);
      const vfloat<K> org_ray_tnear = max(ray.tnear(), 0.0f);
      const vfloat<K> org_ray_tfar  = max(ray.tfar , 0.0f);

      tray.tnear = select(valid, org_ray_tnear, vfloat<K>(pos_inf));
      tray.tfar  = select(valid, org_ray_tfar , vfloat<K>(neg_inf));

      vbool<K> terminated = !valid;
      const vfloat<K> inf = vfloat<K>(pos_inf);

      /* determine switch threshold based on flags */
      const size_t switchThreshold = (context->user && context->isCoherent()) ? 2 : switchThresholdIncoherent;

      /* allocate stack and push root node */
      vfloat<K> stack_near[stackSizeChunk];
      NodeRef stack_node[stackSizeChunk];
      stack_node[0] = BVH::invalidNode;
      stack_near[0] = inf;
      stack_node[1] = bvh->root;
      stack_near[1] = tray.tnear;
      NodeRef* stackEnd MAYBE_UNUSED = stack_node+stackSizeChunk;
      NodeRef* __restrict__ sptr_node = stack_node + 2;
      vfloat<K>* __restrict__ sptr_near = stack_near + 2;

      while (1) pop:
      {
        /* pop next node from stack */
        assert(sptr_node > stack_node);
        sptr_node--;
        sptr_near--;
        NodeRef cur = *sptr_node;
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }

        /* cull node if behind closest hit point */
        vfloat<K> curDist = *sptr_near;
        const vbool<K> active = curDist < tray.tfar;
        if (unlikely(none(active)))
          continue;

        /* switch to single ray traversal */
#if (!defined(__WIN32__) || defined(__X86_64__)) && ((defined(__aarch64__)) || defined(__SSE4_2__))
#if FORCE_SINGLE_MODE == 0
        if (single)
#endif
        {
          size_t bits = movemask(active);
#if FORCE_SINGLE_MODE == 0
          if (unlikely(popcnt(bits) <= switchThreshold)) 
#endif
          {
            for (; bits!=0; ) {
              const size_t i = bscf(bits);
              if (occluded1(This, bvh, cur, i, pre, ray, tray, context))
                set(terminated, i);
            }
            if (all(terminated)) break;
            tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar);
            continue;
          }
        }
#endif

        while (likely(!cur.isLeaf()))
        {
          /* process nodes */
          const vbool<K> valid_node = tray.tfar > curDist;
          STAT3(shadow.trav_nodes, 1, popcnt(valid_node), K);
          const NodeRef nodeRef = cur;
          const BaseNode* __restrict__ const node = nodeRef.baseNode();

          /* set cur to invalid */
          cur = BVH::emptyNode;
          curDist = pos_inf;

          for (unsigned i = 0; i < N; i++)
          {
            const NodeRef child = node->children[i];
            if (unlikely(child == BVH::emptyNode)) break;
            vfloat<K> lnearP;
            vbool<K> lhit = valid_node;
            BVHNNodeIntersectorK<N, K, types, robust>::intersect(nodeRef, i, tray, ray.time(), lnearP, lhit);

            /* if we hit the child we push the previously hit node onto the stack, and continue with the currently hit child */
            if (likely(any(lhit)))
            {
              assert(sptr_node < stackEnd);
              assert(child != BVH::emptyNode);
              const vfloat<K> childDist = select(lhit, lnearP, inf);

              /* push 'cur' node onto stack and continue with hit child */
              if (likely(cur != BVH::emptyNode)) {
                *sptr_node = cur; sptr_node++;
                *sptr_near = curDist; sptr_near++;
              }
              curDist = childDist;
              cur = child;
            }
          }
          if (unlikely(cur == BVH::emptyNode))
            goto pop;

#if SWITCH_DURING_DOWN_TRAVERSAL == 1
          if (single)
          {
            // seems to be the best place for testing utilization
            if (unlikely(popcnt(tray.tfar > curDist) <= switchThreshold))
            {
              *sptr_node++ = cur;
              *sptr_near++ = curDist;
              goto pop;
            }
          }
#endif
	}

        /* return if stack is empty */
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }


        /* intersect leaf */
        assert(cur != BVH::emptyNode);
        const vbool<K> valid_leaf = tray.tfar > curDist;
        STAT3(shadow.trav_leaves, 1, popcnt(valid_leaf), K);
        if (unlikely(none(valid_leaf))) continue;
        size_t items; const Primitive* prim = (Primitive*) cur.leaf(items);

        size_t lazy_node = 0;
        terminated |= PrimitiveIntersectorK::occluded(!terminated, This, pre, ray, context, prim, items, tray, lazy_node);
        if (all(terminated)) break;
        tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar); // ignore node intersections for terminated rays

        if (unlikely(lazy_node)) {
          *sptr_node = lazy_node; sptr_node++;
          *sptr_near = neg_inf;   sptr_near++;
        }
      }

      vfloat<K>::store(valid & terminated, &ray.tfar, neg_inf);
    }